

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::BrandedDecl
          (BrandedDecl *this,ResolvedDecl *decl,
          Own<capnp::compiler::NodeTranslator::BrandScope> *brand,Reader source)

{
  Own<capnp::compiler::NodeTranslator::BrandScope> *other;
  ResolvedDecl *params;
  Own<capnp::compiler::NodeTranslator::BrandScope> *brand_local;
  ResolvedDecl *decl_local;
  BrandedDecl *this_local;
  
  kj::
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  ::OneOf(&this->body);
  other = kj::mv<kj::Own<capnp::compiler::NodeTranslator::BrandScope>>(brand);
  kj::Own<capnp::compiler::NodeTranslator::BrandScope>::Own(&this->brand,other);
  (this->source)._reader.dataSize = source._reader.dataSize;
  (this->source)._reader.pointerCount = source._reader.pointerCount;
  *(undefined2 *)&(this->source)._reader.field_0x26 = source._reader._38_2_;
  (this->source)._reader.nestingLimit = source._reader.nestingLimit;
  *(undefined4 *)&(this->source)._reader.field_0x2c = source._reader._44_4_;
  (this->source)._reader.data = source._reader.data;
  (this->source)._reader.pointers = source._reader.pointers;
  (this->source)._reader.segment = source._reader.segment;
  (this->source)._reader.capTable = source._reader.capTable;
  params = kj::mv<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(decl);
  kj::
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  ::
  init<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>
            ((OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
              *)this,params);
  return;
}

Assistant:

inline BrandedDecl(Resolver::ResolvedDecl decl,
                     kj::Own<NodeTranslator::BrandScope>&& brand,
                     Expression::Reader source)
      : brand(kj::mv(brand)), source(source) {
    body.init<Resolver::ResolvedDecl>(kj::mv(decl));
  }